

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O0

void __thiscall
notch::io::PlainTextNetworkReader::read_layer_config
          (PlainTextNetworkReader *this,istream *in,size_t *inputDim,size_t *outputDim,
          string *activationTag,Array *weights,Array *bias)

{
  bool bVar1;
  byte bVar2;
  runtime_error *prVar3;
  byte local_da;
  string local_c8 [32];
  PlainTextNetworkReader local_a8 [4];
  PlainTextNetworkReader local_88 [6];
  string local_58 [8];
  string tag;
  Array *weights_local;
  string *activationTag_local;
  size_t *outputDim_local;
  size_t *inputDim_local;
  istream *in_local;
  PlainTextNetworkReader *this_local;
  
  std::__cxx11::string::string(local_58);
  while( true ) {
    while( true ) {
      while( true ) {
        bVar1 = std::ios::operator_cast_to_bool((ios *)(in + *(long *)(*(long *)in + -0x18)));
        local_da = 0;
        if (bVar1) {
          local_da = std::ios::eof();
          local_da = local_da ^ 0xff;
        }
        if ((local_da & 1) == 0) goto LAB_00147e33;
        read_tag_abi_cxx11_(local_88,(istream *)this);
        std::__cxx11::string::operator=(local_58,(string *)local_88);
        std::__cxx11::string::~string((string *)local_88);
        bVar2 = std::ios::operator!((ios *)(in + *(long *)(*(long *)in + -0x18)));
        if ((bVar2 & 1) != 0) {
          prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar3,"unexpected end of layer record");
          __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_58,"inputs:");
        if (!bVar1) break;
        read_value<unsigned_long>(this,in,inputDim);
      }
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"outputs:");
      if (!bVar1) break;
      read_value<unsigned_long>(this,in,outputDim);
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"activation:");
    if (!bVar1) break;
    read_value<std::__cxx11::string>
              (local_a8,(istream *)this,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in);
    std::__cxx11::string::~string((string *)local_a8);
  }
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_58,"bias_and_weights:");
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)local_c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   "unsupported layer attribute: ");
    std::runtime_error::runtime_error(prVar3,local_c8);
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  core::std::valarray<float>::resize(weights,*inputDim * *outputDim,0.0);
  core::std::valarray<float>::resize(bias,*outputDim,0.0);
  read_weights(this,in,weights,bias);
LAB_00147e33:
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void read_layer_config(std::istream &in,
                           size_t &inputDim, size_t &outputDim,
                           std::string &activationTag,
                           Array &weights, Array &bias) {
        std::string tag;
        while (in && !in.eof()) {
            tag = read_tag(in);
            if (!in) { // trying to read past EOF or other errors
                throw std::runtime_error("unexpected end of layer record");
            }
            if (tag == "inputs:") {
                read_value<size_t>(in, inputDim);
            } else if (tag == "outputs:") {
                read_value<size_t>(in, outputDim);
            } else if (tag == "activation:") {
                read_value<std::string>(in, activationTag);
            } else if (tag == "bias_and_weights:") {
                weights.resize(inputDim * outputDim, 0.0);
                bias.resize(outputDim, 0.0);
                read_weights(in, weights, bias);
                break; // this should be the last layer attribute
            } else {
                throw std::runtime_error("unsupported layer attribute: " + tag);
            }
        };
    }